

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void processCompileOptionsInternal
               (cmGeneratorTarget *tgt,
               vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *options,
               hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
               *uniqueOptions,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugOptions,char *logName,string *language)

{
  char *pcVar1;
  long *plVar2;
  undefined8 *puVar3;
  size_type *psVar4;
  ulong *puVar5;
  long *plVar6;
  ulong uVar7;
  pointer __obj;
  undefined7 in_stack_00000009;
  string *in_stack_00000020;
  string usedOptions;
  pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  __p;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryOptions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  cmGeneratorTarget *local_190;
  long *local_188;
  undefined8 local_180;
  long local_178;
  undefined8 uStack_170;
  ulong *local_168;
  long local_160;
  ulong local_158;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined1 *local_148;
  long local_140;
  undefined1 local_138;
  undefined7 uStack_137;
  ulong *local_128;
  long local_120;
  ulong local_118 [2];
  cmListFileBacktrace local_108;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  long *local_68 [2];
  long local_58 [2];
  cmake *local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  cmGeneratorExpressionDAGChecker *local_38;
  
  if (entries !=
      (vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
       *)options) {
    local_190 = tgt;
    local_40 = options;
    local_38 = (cmGeneratorExpressionDAGChecker *)config;
    do {
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar1 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)((*(pointer *)entries)->_M_dataplus)._M_p
                          ,local_190->LocalGenerator,
                          (string *)CONCAT71(in_stack_00000009,debugOptions),false,local_190,
                          local_38,in_stack_00000020);
      std::__cxx11::string::string((string *)&local_108,pcVar1,(allocator *)&local_148);
      cmSystemTools::ExpandListArgument((string *)&local_108,&local_88,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108.Context.Name._M_dataplus._M_p != &local_108.Context.Name.field_2) {
        operator_delete(local_108.Context.Name._M_dataplus._M_p,
                        local_108.Context.Name.field_2._M_allocated_capacity + 1);
      }
      local_148 = &local_138;
      local_140 = 0;
      local_138 = 0;
      __obj = local_88.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      if (local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          cmsys::
          hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          ::resize((hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                    *)dagChecker,*(long *)((long)&(dagChecker->Target).field_2 + 8) + 1);
          cmsys::
          hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          ::insert_unique_noresize
                    ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                      *)&local_108,
                     (hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                      *)dagChecker,__obj);
          if (local_108.Context.Name.field_2._M_local_buf[0] == '\x01') {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)uniqueOptions,__obj);
            if ((char)logName != '\0') {
              std::operator+(&local_1b0," * ",__obj);
              plVar2 = (long *)std::__cxx11::string::append((char *)&local_1b0);
              local_108.Context.Name._M_dataplus._M_p = (pointer)&local_108.Context.Name.field_2;
              psVar4 = (size_type *)(plVar2 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar2 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar4) {
                local_108.Context.Name.field_2._M_allocated_capacity = *psVar4;
                local_108.Context.Name.field_2._8_8_ = plVar2[3];
              }
              else {
                local_108.Context.Name.field_2._M_allocated_capacity = *psVar4;
                local_108.Context.Name._M_dataplus._M_p = (pointer)*plVar2;
              }
              local_108.Context.Name._M_string_length = plVar2[1];
              *plVar2 = (long)psVar4;
              plVar2[1] = 0;
              *(undefined1 *)(plVar2 + 2) = 0;
              std::__cxx11::string::_M_append
                        ((char *)&local_148,(ulong)local_108.Context.Name._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108.Context.Name._M_dataplus._M_p != &local_108.Context.Name.field_2) {
                operator_delete(local_108.Context.Name._M_dataplus._M_p,
                                local_108.Context.Name.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                operator_delete(local_1b0._M_dataplus._M_p,
                                local_1b0.field_2._M_allocated_capacity + 1);
              }
            }
          }
          __obj = __obj + 1;
        } while (__obj != local_88.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
        if (local_140 != 0) {
          local_48 = cmLocalGenerator::GetCMakeInstance(local_190->LocalGenerator);
          local_68[0] = local_58;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Used compile ","");
          plVar2 = (long *)std::__cxx11::string::append((char *)local_68);
          puVar5 = (ulong *)(plVar2 + 2);
          if ((ulong *)*plVar2 == puVar5) {
            local_158 = *puVar5;
            uStack_150 = (undefined4)plVar2[3];
            uStack_14c = *(undefined4 *)((long)plVar2 + 0x1c);
            local_168 = &local_158;
          }
          else {
            local_158 = *puVar5;
            local_168 = (ulong *)*plVar2;
          }
          local_160 = plVar2[1];
          *plVar2 = (long)puVar5;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          local_128 = local_118;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_128," for target ","");
          uVar7 = 0xf;
          if (local_168 != &local_158) {
            uVar7 = local_158;
          }
          if (uVar7 < (ulong)(local_120 + local_160)) {
            uVar7 = 0xf;
            if (local_128 != local_118) {
              uVar7 = local_118[0];
            }
            if (uVar7 < (ulong)(local_120 + local_160)) goto LAB_003877be;
            puVar3 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_168)
            ;
          }
          else {
LAB_003877be:
            puVar3 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_128);
          }
          plVar2 = puVar3 + 2;
          if ((long *)*puVar3 == plVar2) {
            local_178 = *plVar2;
            uStack_170 = puVar3[3];
            local_188 = &local_178;
          }
          else {
            local_178 = *plVar2;
            local_188 = (long *)*puVar3;
          }
          local_180 = puVar3[1];
          *puVar3 = plVar2;
          puVar3[1] = 0;
          *(undefined1 *)plVar2 = 0;
          plVar2 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_188,
                                      (ulong)(local_190->Target->Name)._M_dataplus._M_p);
          local_c8 = &local_b8;
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_b8 = *plVar6;
            lStack_b0 = plVar2[3];
          }
          else {
            local_b8 = *plVar6;
            local_c8 = (long *)*plVar2;
          }
          local_c0 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_c8);
          local_a8 = &local_98;
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_98 = *plVar6;
            lStack_90 = plVar2[3];
          }
          else {
            local_98 = *plVar6;
            local_a8 = (long *)*plVar2;
          }
          local_a0 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_148);
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          psVar4 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar4) {
            local_1b0.field_2._M_allocated_capacity = *psVar4;
            local_1b0.field_2._8_4_ = (undefined4)plVar2[3];
            local_1b0.field_2._12_4_ = *(undefined4 *)((long)plVar2 + 0x1c);
          }
          else {
            local_1b0.field_2._M_allocated_capacity = *psVar4;
            local_1b0._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_1b0._M_string_length = plVar2[1];
          *plVar2 = (long)psVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)((*(pointer *)entries)->_M_dataplus)._M_p;
          local_108.Context.Name._M_dataplus._M_p = (pointer)&local_108.Context.Name.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_108,*plVar2,plVar2[1] + *plVar2);
          local_108.Context.Line = plVar2[4];
          local_108.Snapshot.Position.Position = plVar2[7];
          local_108.Snapshot.State = (cmState *)plVar2[5];
          local_108.Snapshot.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)plVar2[6];
          cmake::IssueMessage(local_48,LOG,&local_1b0,&local_108,false);
          cmListFileBacktrace::~cmListFileBacktrace(&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          if (local_a8 != &local_98) {
            operator_delete(local_a8,local_98 + 1);
          }
          if (local_c8 != &local_b8) {
            operator_delete(local_c8,local_b8 + 1);
          }
          if (local_188 != &local_178) {
            operator_delete(local_188,local_178 + 1);
          }
          if (local_128 != local_118) {
            operator_delete(local_128,local_118[0] + 1);
          }
          if (local_168 != &local_158) {
            operator_delete(local_168,local_158 + 1);
          }
          if (local_68[0] != local_58) {
            operator_delete(local_68[0],local_58[0] + 1);
          }
        }
      }
      if (local_148 != &local_138) {
        operator_delete(local_148,CONCAT71(uStack_137,local_138) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
      entries = (vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                 *)((long)entries + 8);
    } while (entries !=
             (vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
              *)local_40);
  }
  return;
}

Assistant:

static void processCompileOptionsInternal(cmGeneratorTarget const* tgt,
      const std::vector<cmGeneratorTarget::TargetPropertyEntry*> &entries,
      std::vector<std::string> &options,
      UNORDERED_SET<std::string> &uniqueOptions,
      cmGeneratorExpressionDAGChecker *dagChecker,
      const std::string& config, bool debugOptions, const char *logName,
      std::string const& language)
{
  for (std::vector<cmGeneratorTarget::TargetPropertyEntry*>::const_iterator
      it = entries.begin(), end = entries.end(); it != end; ++it)
    {
    std::vector<std::string> entryOptions;
    cmSystemTools::ExpandListArgument((*it)->ge->Evaluate(
                                        tgt->GetLocalGenerator(),
                                              config,
                                              false,
                                              tgt,
                                              dagChecker,
                                              language),
                                    entryOptions);
    std::string usedOptions;
    for(std::vector<std::string>::iterator
          li = entryOptions.begin(); li != entryOptions.end(); ++li)
      {
      std::string const& opt = *li;

      if(uniqueOptions.insert(opt).second)
        {
        options.push_back(opt);
        if (debugOptions)
          {
          usedOptions += " * " + opt + "\n";
          }
        }
      }
    if (!usedOptions.empty())
      {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(cmake::LOG,
                            std::string("Used compile ") + logName
                            + std::string(" for target ")
                            + tgt->GetName() + ":\n"
                            + usedOptions, (*it)->ge->GetBacktrace());
      }
    }
}